

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O0

int Armor_off(void)

{
  int iVar1;
  char *pcVar2;
  
  if (uarm != (obj *)0x0) {
    Oprops_off(uarm,1);
    if (((uarm != (obj *)0x0) &&
        ((((0x5e < uarm->otyp && (uarm->otyp < 0x6a)) ||
          ((0x53 < uarm->otyp && (uarm->otyp < 0x5f)))) &&
         ((obj_descr[objects[uarm->otyp].oc_descr_idx].oc_descr != (char *)0x0 &&
          (iVar1 = strncmp(obj_descr[objects[uarm->otyp].oc_descr_idx].oc_descr,"gold ",5),
          iVar1 == 0)))))) &&
       (((end_burn(uarm,'\0'), u.uprops[0x1e].intrinsic == 0 &&
         (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
          (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
        ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))))) {
      pcVar2 = Tobjnam(uarm,"stop");
      pline("%s glowing.",pcVar2);
    }
    Armor_off_sub('\0');
    takeoff_mask = takeoff_mask & 0xfffffffe;
    setworn((obj *)0x0,1);
    encumber_msg();
    cancelled_don = '\0';
  }
  return 0;
}

Assistant:

int Armor_off(void)
{
    if (!uarm) return 0;

    Oprops_off(uarm, W_ARM);

    if (uarm && Is_gold_dragon_armor(uarm->otyp)) {
	end_burn(uarm, FALSE);
	if (!Blind)
	    pline("%s glowing.", Tobjnam(uarm, "stop"));
    }
    Armor_off_sub(FALSE);
    takeoff_mask &= ~W_ARM;
    setworn(NULL, W_ARM);
    encumber_msg();
    cancelled_don = FALSE;
    return 0;
}